

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O1

void __thiscall webrtc::PushResampler<float>::~PushResampler(PushResampler<float> *this)

{
  float *pfVar1;
  PushSincResampler *pPVar2;
  
  this->_vptr_PushResampler = (_func_int **)&PTR__PushResampler_001cfbf0;
  pfVar1 = (this->dst_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  (this->dst_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  pfVar1 = (this->dst_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  (this->dst_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  pfVar1 = (this->src_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  (this->src_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  pfVar1 = (this->src_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  (this->src_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  pPVar2 = (this->sinc_resampler_right_)._M_t.
           super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
           .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl;
  if (pPVar2 != (PushSincResampler *)0x0) {
    (*(pPVar2->super_SincResamplerCallback)._vptr_SincResamplerCallback[1])();
  }
  (this->sinc_resampler_right_)._M_t.
  super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>.
  _M_t.
  super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
  .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl = (PushSincResampler *)0x0
  ;
  pPVar2 = (this->sinc_resampler_)._M_t.
           super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
           .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl;
  if (pPVar2 != (PushSincResampler *)0x0) {
    (*(pPVar2->super_SincResamplerCallback)._vptr_SincResamplerCallback[1])();
  }
  (this->sinc_resampler_)._M_t.
  super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>.
  _M_t.
  super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
  .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl = (PushSincResampler *)0x0
  ;
  return;
}

Assistant:

PushResampler<T>::~PushResampler() {
}